

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

void __thiscall
cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(CoinSelectionOption *this)

{
  uint32_t uVar1;
  long in_RDI;
  ConfidentialTxOutReference txout;
  ConfidentialTxOut ctxout;
  Script wpkh_script;
  ConfidentialTxOutReference *this_00;
  Script local_328;
  Script local_2f0;
  ConfidentialTxOutReference local_2b8;
  ConfidentialValue local_1c0;
  ConfidentialAssetId local_198;
  ConfidentialTxOut local_170;
  allocator local_61;
  string local_60;
  Script local_40;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_60,"0014ffffffffffffffffffffffffffffffffffffffff",&local_61);
  core::Script::Script(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  core::ConfidentialAssetId::ConfidentialAssetId(&local_198);
  core::ConfidentialValue::ConfidentialValue(&local_1c0);
  core::ConfidentialTxOut::ConfidentialTxOut(&local_170,&local_40,&local_198,&local_1c0);
  core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x52c74c);
  core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x52c759);
  core::ConfidentialTxOutReference::ConfidentialTxOutReference(&local_2b8,&local_170);
  uVar1 = core::ConfidentialTxOutReference::GetSerializeVsize
                    (&local_2b8,true,*(int *)(in_RDI + 0x60),*(int *)(in_RDI + 100),(uint32_t *)0x0,
                     0);
  *(uint32_t *)(in_RDI + 4) = uVar1;
  core::Script::Script(&local_2f0);
  core::Script::Script(&local_328);
  this_00 = (ConfidentialTxOutReference *)0x0;
  uVar1 = core::ConfidentialTxIn::EstimateTxInVsize
                    (kP2wpkhAddress,&local_2f0,0,&local_328,false,false,false,(Script *)0x0,0,0x34,
                     (uint32_t *)0x0,0);
  *(uint32_t *)(in_RDI + 8) = uVar1;
  core::Script::~Script((Script *)this_00);
  core::Script::~Script((Script *)this_00);
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference(this_00);
  core::ConfidentialTxOut::~ConfidentialTxOut(&local_170);
  core::Script::~Script((Script *)this_00);
  return;
}

Assistant:

void CoinSelectionOption::InitializeConfidentialTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  ConfidentialTxOut ctxout(
      wpkh_script, ConfidentialAssetId(), ConfidentialValue());
  ConfidentialTxOutReference txout(ctxout);
  change_output_size_ =
      txout.GetSerializeVsize(true, exponent_, minimum_bits_);
  change_spend_size_ = ConfidentialTxIn::EstimateTxInVsize(
      AddressType::kP2wpkhAddress, Script(), 0, Script(), false, false);
}